

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O3

pair<double,_double> __thiscall
anurbs::NurbsSurfaceGeometry<2L>::greville_point
          (NurbsSurfaceGeometry<2L> *this,Index index_u,Index index_v)

{
  int iVar1;
  int iVar2;
  int extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar3;
  pair<double,_double> pVar4;
  double local_38;
  double local_30;
  
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  local_30 = 0.0;
  local_38 = 0.0;
  if (CONCAT44(extraout_var,iVar1) != 0 && -1 < extraout_var) {
    local_38 = 0.0;
    lVar3 = 0;
    do {
      if ((index_u < 0) ||
         ((this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows <= index_u + lVar3)) goto LAB_00248ae5;
      local_38 = local_38 +
                 (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[index_u + lVar3];
      lVar3 = lVar3 + 1;
      iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    } while (lVar3 < CONCAT44(extraout_var_00,iVar1));
  }
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  if (CONCAT44(extraout_var_02,iVar2) != 0 && -1 < extraout_var_02) {
    local_30 = 0.0;
    lVar3 = 0;
    do {
      if ((index_v < 0) ||
         ((this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows <= index_v + lVar3)) {
LAB_00248ae5:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa2,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      local_30 = local_30 +
                 (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[index_v + lVar3];
      lVar3 = lVar3 + 1;
      iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
    } while (lVar3 < CONCAT44(extraout_var_03,iVar2));
  }
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  pVar4.second = local_30 / (double)CONCAT44(extraout_var_04,iVar2);
  pVar4.first = local_38 / (double)CONCAT44(extraout_var_01,iVar1);
  return pVar4;
}

Assistant:

std::pair<double, double> greville_point(Index index_u, Index index_v) const
    {
        double u = 0.0;
        double v = 0.0;

        for (Index i = 0; i < degree_u(); i++) {
            u += knot_u(index_u + i);
        }

        u /= degree_u();

        for (Index i = 0; i < degree_v(); i++) {
            v += knot_v(index_v + i);
        }

        v /= degree_v();

        return {u, v};
    }